

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListEntryArray.cpp
# Opt level: O0

void __thiscall DestListEntryArray::printDestListEntryArray(DestListEntryArray *this)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  int local_14;
  DestListEntryArray *pDStack_10;
  int i;
  DestListEntryArray *this_local;
  
  pDStack_10 = this;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "_______________________DestList__________________________");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  while( true ) {
    uVar4 = (ulong)local_14;
    sVar5 = std::
            vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
            ::size(&this->destListEntryArray);
    if (sVar5 <= uVar4) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"DestListEntry ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14 + 1);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"  Checksum:                         ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_30,&pvVar6->Checksum);
    Utils::print_vec(&local_30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
    std::operator<<((ostream *)&std::cout,"  VolumeId:                         ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,&pvVar6->VolumeId);
    Utils::printSid(&local_58,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"  ObjectId:                         ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,&pvVar6->ObjectId);
    Utils::printSid(&local_70,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_70);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"     Birth Mac:                     ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,&pvVar6->ObjectId);
    Utils::printMacAddr(&local_88,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
    poVar3 = std::operator<<((ostream *)&std::cout,"     Sequence Number:               ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a0,&pvVar6->ObjectId);
    iVar1 = Utils::lenTwoBytesFromPos(&local_a0,8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a0);
    std::operator<<((ostream *)&std::cout,"  BirthVolumeId:                    ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_b8,&pvVar6->BirthVolumeId);
    Utils::printSid(&local_b8,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"  BirthObjectId:                    ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_d0,&pvVar6->BirthObjectId);
    Utils::printSid(&local_d0,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d0);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"  NetBIOSName:                      ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    Utils::print_vec_unicode(&pvVar6->NetBIOSName);
    poVar3 = std::operator<<((ostream *)&std::cout,"  EntryId:                          ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e8,&pvVar6->EntryId);
    uVar2 = Utils::lenFourBytes(&local_e8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
    std::operator<<((ostream *)&std::cout,"  Reserved1:                        ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_100,&pvVar6->Reserved1);
    Utils::print_vec(&local_100);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
    std::operator<<((ostream *)&std::cout,"  MSFileTime:                       ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_118,&pvVar6->MSFileTime)
    ;
    Utils::getDateFromPos(&local_118,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_118);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar3 = std::operator<<(poVar3," Time of last recorded access.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"  EntryPinStatus:                   ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_130,&pvVar6->EntryPinStatus);
    Utils::print_vec(&local_130);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_130);
    std::operator<<((ostream *)&std::cout,"  Reserved2:                        ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_148,&pvVar6->Reserved2);
    Utils::print_vec(&local_148);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_148);
    poVar3 = std::operator<<((ostream *)&std::cout,"  AccessedCount:                    ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_160,&pvVar6->AccessedCount);
    uVar2 = Utils::lenFourBytes(&local_160);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_160);
    std::operator<<((ostream *)&std::cout,"  Reserved3:                        ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_178,&pvVar6->Reserved3);
    Utils::print_vec(&local_178);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_178);
    poVar3 = std::operator<<((ostream *)&std::cout,"  LengthOfUnicodeData:              ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_190,&pvVar6->LengthOfUnicodeData);
    iVar1 = Utils::lenTwoBytes(&local_190);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1 * 2);
    poVar3 = std::operator<<(poVar3," bytes");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_190);
    std::operator<<((ostream *)&std::cout,"  EntryStringData:                  ");
    pvVar6 = std::
             vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
             ::operator[](&this->destListEntryArray,(long)local_14);
    Utils::print_vec_unicode(&pvVar6->EntryStringData);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DestListEntryArray::printDestListEntryArray() {
    cout << "_______________________DestList__________________________" << endl;
    for(int i = 0; i < destListEntryArray.size(); ++i) {
        cout << "DestListEntry " << dec << i + 1 << endl;
        cout << "  Checksum:                         "; Utils::print_vec(destListEntryArray[i].Checksum);
        cout << "  VolumeId:                         "; Utils::printSid(destListEntryArray[i].VolumeId, 0); cout << endl;
        cout << "  ObjectId:                         "; Utils::printSid(destListEntryArray[i].ObjectId, 0); cout << endl;
        cout << "     Birth Mac:                     "; Utils::printMacAddr(destListEntryArray[i].ObjectId, 0);

        cout << "     Sequence Number:               " <<
            dec << Utils::lenTwoBytesFromPos(destListEntryArray[i].ObjectId, 8) << endl;
//        cout << "     Creation Date:                 "; Utils::getDateFromPos(destListEntryArray[i].ObjectId, 0);
        cout << "  BirthVolumeId:                    "; Utils::printSid(destListEntryArray[i].BirthVolumeId, 0); cout << endl;
        cout << "  BirthObjectId:                    "; Utils::printSid(destListEntryArray[i].BirthObjectId, 0); cout << endl;
        cout << "  NetBIOSName:                      "; Utils::print_vec_unicode(destListEntryArray[i].NetBIOSName);
        cout << "  EntryId:                          " << dec << Utils::lenFourBytes(destListEntryArray[i].EntryId) << endl;
        cout << "  Reserved1:                        "; Utils::print_vec(destListEntryArray[i].Reserved1);
        cout << "  MSFileTime:                       "; Utils::getDateFromPos(destListEntryArray[i].MSFileTime, 0);
            cout << Utils::defaultOffsetDocInfo << " Time of last recorded access." << endl;
        cout << "  EntryPinStatus:                   "; Utils::print_vec(destListEntryArray[i].EntryPinStatus);
        cout << "  Reserved2:                        "; Utils::print_vec(destListEntryArray[i].Reserved2);
        cout << "  AccessedCount:                    " << dec << Utils::lenFourBytes(destListEntryArray[i].AccessedCount) << endl;
        cout << "  Reserved3:                        "; Utils::print_vec(destListEntryArray[i].Reserved3);
        cout << "  LengthOfUnicodeData:              "<< dec <<
            2 * Utils::lenTwoBytes(destListEntryArray[i].LengthOfUnicodeData) << " bytes" << endl;
        cout << "  EntryStringData:                  "; Utils::print_vec_unicode(destListEntryArray[i].EntryStringData);
        cout << endl;
    }
    cout << "_________________________________________________________" << endl;
}